

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_4,_4> * tcu::operator*(Matrix<double,_4,_2> *a,Matrix<double,_2,_4> *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  undefined8 *puVar7;
  Matrix<double,_4,_4> *res;
  double *in_RDI;
  double *pdVar8;
  int row;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  
  in_RDI[0xe] = 0.0;
  in_RDI[0xf] = 0.0;
  in_RDI[0xc] = 0.0;
  in_RDI[0xd] = 0.0;
  in_RDI[10] = 0.0;
  in_RDI[0xb] = 0.0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  lVar6 = 0;
  lVar9 = 0;
  pdVar8 = in_RDI;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3ff0000000000000;
      if (lVar6 != lVar10) {
        uVar11 = 0;
      }
      *(undefined8 *)((long)pdVar8 + lVar10) = uVar11;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
    lVar9 = lVar9 + 1;
    pdVar8 = pdVar8 + 1;
    lVar6 = lVar6 + 0x20;
  } while (lVar9 != 4);
  puVar7 = in_RDI + 4;
  lVar6 = 0;
  do {
    dVar2 = (a->m_data).m_data[0].m_data[lVar6];
    dVar3 = (a->m_data).m_data[1].m_data[lVar6];
    lVar9 = 0;
    do {
      pdVar8 = (double *)((long)(b->m_data).m_data[0].m_data + lVar9);
      pdVar1 = (double *)((long)(b->m_data).m_data[1].m_data + lVar9);
      dVar4 = *pdVar1;
      dVar5 = pdVar1[1];
      *(double *)((long)puVar7 + lVar9 * 2 + -0x20) = pdVar8[1] * dVar3 + *pdVar8 * dVar2 + 0.0;
      *(double *)((long)puVar7 + lVar9 * 2) = dVar5 * dVar3 + dVar4 * dVar2 + 0.0;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x40);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 1;
  } while (lVar6 != 4);
  return (Matrix<double,_4,_4> *)in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}